

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode deleteReference(UA_Server *server,UA_Session *session,UA_DeleteReferencesItem *item)

{
  undefined1 local_a0 [8];
  UA_DeleteReferencesItem secondItem;
  UA_StatusCode retval;
  UA_DeleteReferencesItem *item_local;
  UA_Session *session_local;
  UA_Server *server_local;
  
  secondItem._108_4_ =
       UA_Server_editNode(server,session,&item->sourceNodeId,deleteOneWayReference,item);
  server_local._4_4_ = secondItem._108_4_;
  if (((secondItem._108_4_ == 0) && ((item->deleteBidirectional & 1U) != 0)) &&
     ((item->targetNodeId).serverIndex == 0)) {
    UA_DeleteReferencesItem_init((UA_DeleteReferencesItem *)local_a0);
    secondItem.referenceTypeId.identifier.guid.data4[0] = (item->isForward ^ 0xffU) & 1;
    local_a0._0_2_ = (item->targetNodeId).nodeId.namespaceIndex;
    local_a0._2_2_ = *(undefined2 *)&(item->targetNodeId).nodeId.field_0x2;
    local_a0._4_4_ = (item->targetNodeId).nodeId.identifierType;
    secondItem.sourceNodeId._0_8_ = (item->targetNodeId).nodeId.identifier.string.length;
    secondItem.sourceNodeId.identifier.string.length =
         (size_t)(item->targetNodeId).nodeId.identifier.string.data;
    secondItem._48_8_ = *(undefined8 *)&item->sourceNodeId;
    secondItem.targetNodeId.nodeId._0_8_ = (item->sourceNodeId).identifier.string.length;
    secondItem.targetNodeId.nodeId.identifier.string.length =
         (size_t)(item->sourceNodeId).identifier.string.data;
    secondItem.sourceNodeId.identifier.string.data =
         (UA_Byte *)*(undefined8 *)&item->referenceTypeId;
    secondItem.referenceTypeId._0_8_ = (item->referenceTypeId).identifier.string.length;
    secondItem.referenceTypeId.identifier.string.length =
         (size_t)(item->referenceTypeId).identifier.string.data;
    server_local._4_4_ =
         UA_Server_editNode(server,session,(UA_NodeId *)local_a0,deleteOneWayReference,local_a0);
  }
  return server_local._4_4_;
}

Assistant:

static UA_StatusCode
deleteReference(UA_Server *server, UA_Session *session,
                const UA_DeleteReferencesItem *item) {
    UA_StatusCode retval = UA_Server_editNode(server, session, &item->sourceNodeId,
                                              (UA_EditNodeCallback)deleteOneWayReference, item);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;
    if(!item->deleteBidirectional || item->targetNodeId.serverIndex != 0)
        return retval;
    UA_DeleteReferencesItem secondItem;
    UA_DeleteReferencesItem_init(&secondItem);
    secondItem.isForward = !item->isForward;
    secondItem.sourceNodeId = item->targetNodeId.nodeId;
    secondItem.targetNodeId.nodeId = item->sourceNodeId;
    secondItem.referenceTypeId = item->referenceTypeId;
    return UA_Server_editNode(server, session, &secondItem.sourceNodeId,
                              (UA_EditNodeCallback)deleteOneWayReference, &secondItem);
}